

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageTestsUtil.cpp
# Opt level: O1

string * __thiscall
vkt::image::getShaderImageType_abi_cxx11_
          (string *__return_storage_ptr__,image *this,TextureFormat *format,ImageType imageType,
          bool multisample)

{
  long lVar1;
  TextureChannelClass TVar2;
  size_t sVar3;
  long *plVar4;
  size_type *psVar5;
  uint uVar6;
  char *pcVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string imageTypePart;
  string formatPart;
  long *local_88 [2];
  long local_78 [2];
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  TVar2 = tcu::getTextureChannelClass(*(ChannelType *)(this + 4));
  if (TVar2 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    pcVar7 = "u";
  }
  else {
    TVar2 = tcu::getTextureChannelClass(*(ChannelType *)(this + 4));
    pcVar7 = "";
    if (TVar2 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
      pcVar7 = "i";
    }
  }
  local_48 = local_38;
  sVar3 = strlen(pcVar7);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,pcVar7,pcVar7 + sVar3);
  local_60 = 0;
  local_58 = 0;
  uVar6 = (uint)format;
  local_68 = &local_58;
  if ((char)imageType == '\0') {
    if (7 < uVar6) goto LAB_00730a38;
    pcVar7 = &DAT_00b39514 + *(int *)(&DAT_00b39514 + ((ulong)format & 0xffffffff) * 4);
  }
  else if (uVar6 == 3) {
    pcVar7 = "2DMSArray";
  }
  else {
    if (uVar6 != 2) goto LAB_00730a38;
    pcVar7 = "2DMS";
  }
  std::__cxx11::string::_M_replace((ulong)&local_68,0,(char *)0x0,(ulong)pcVar7);
LAB_00730a38:
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)local_88,local_48,local_40 + (long)local_48);
  std::__cxx11::string::append((char *)local_88);
  plVar4 = (long *)std::__cxx11::string::_M_append((char *)local_88,(ulong)local_68);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar1 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getShaderImageType (const tcu::TextureFormat& format, const ImageType imageType, const bool multisample)
{
	std::string formatPart = tcu::getTextureChannelClass(format.type) == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER ? "u" :
							 tcu::getTextureChannelClass(format.type) == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER   ? "i" : "";

	std::string imageTypePart;
	if (multisample)
	{
		switch (imageType)
		{
			case IMAGE_TYPE_2D:			imageTypePart = "2DMS";			break;
			case IMAGE_TYPE_2D_ARRAY:	imageTypePart = "2DMSArray";	break;

			default:
				DE_ASSERT(false);
		}
	}
	else
	{
		switch (imageType)
		{
			case IMAGE_TYPE_1D:			imageTypePart = "1D";			break;
			case IMAGE_TYPE_1D_ARRAY:	imageTypePart = "1DArray";		break;
			case IMAGE_TYPE_2D:			imageTypePart = "2D";			break;
			case IMAGE_TYPE_2D_ARRAY:	imageTypePart = "2DArray";		break;
			case IMAGE_TYPE_3D:			imageTypePart = "3D";			break;
			case IMAGE_TYPE_CUBE:		imageTypePart = "Cube";			break;
			case IMAGE_TYPE_CUBE_ARRAY:	imageTypePart = "CubeArray";	break;
			case IMAGE_TYPE_BUFFER:		imageTypePart = "Buffer";		break;

			default:
				DE_ASSERT(false);
		}
	}

	return formatPart + "image" + imageTypePart;
}